

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::ParseTextureNameAndOption
               (string *texname,texture_option_t *texopt,char *linebuf,bool is_bump)

{
  byte bVar1;
  bool bVar2;
  undefined1 extraout_AL;
  int iVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  texture_type_t tVar5;
  real_t *z;
  byte *pbVar6;
  undefined1 uVar7;
  real_t *y;
  real_t *x;
  real_t rVar8;
  undefined4 in_XMM1_Da;
  uint in_XMM1_Db;
  byte *local_e0;
  allocator<char> local_d5;
  uint local_d4;
  real_t *local_d0;
  real_t *local_c8;
  real_t *local_c0;
  real_t *local_b8;
  real_t *local_b0;
  real_t *local_a8;
  real_t *local_a0;
  real_t *local_98;
  real_t *local_90;
  real_t *local_88;
  real_t *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string texture_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  texture_name._M_dataplus._M_p = (pointer)&texture_name.field_2;
  texture_name._M_string_length = 0;
  texture_name.field_2._M_local_buf[0] = '\0';
  texopt->imfchan = is_bump ^ 0x6d;
  texopt->bump_multiplier = 1.0;
  local_d4 = 0;
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  local_c8 = &texopt->brightness;
  local_d0 = &texopt->contrast;
  local_80 = texopt->origin_offset;
  texopt->sharpness = 1.0;
  texopt->brightness = 0.0;
  texopt->contrast = 1.0;
  texopt->origin_offset[0] = 0.0;
  local_88 = texopt->origin_offset + 1;
  local_90 = texopt->origin_offset + 2;
  local_98 = texopt->scale;
  local_a0 = texopt->scale + 1;
  texopt->origin_offset[1] = 0.0;
  texopt->origin_offset[2] = 0.0;
  texopt->scale[0] = 1.0;
  texopt->scale[1] = 1.0;
  local_a8 = texopt->scale + 2;
  local_b0 = texopt->turbulence;
  *(undefined8 *)(texopt->scale + 2) = 0x3f800000;
  texopt->turbulence[1] = 0.0;
  texopt->turbulence[2] = 0.0;
  texopt->type = TEXTURE_TYPE_NONE;
  local_b8 = texopt->turbulence + 1;
  local_c0 = texopt->turbulence + 2;
  local_78 = texname;
LAB_00106ba4:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
                if ((local_d4 & 1) != 0) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(local_78,&texture_name);
                }
                std::__cxx11::string::~string((string *)&texture_name);
                return (bool)extraout_AL;
              }
              sVar4 = strspn(linebuf," \t");
              pbVar6 = (byte *)linebuf + sVar4;
              uVar7 = 0x56;
              local_e0 = pbVar6;
              iVar3 = strncmp((char *)pbVar6,"-blendu",7);
              if ((iVar3 != 0) || ((pbVar6[7] != 0x20 && (pbVar6[7] != 9)))) break;
              local_e0 = pbVar6 + 8;
              bVar2 = parseOnOff((char **)&local_e0,(bool)uVar7);
              texopt->blendu = bVar2;
              linebuf = (char *)local_e0;
            }
            uVar7 = 0x5e;
            iVar3 = strncmp((char *)pbVar6,"-blendv",7);
            if ((iVar3 != 0) || ((pbVar6[7] != 0x20 && (pbVar6[7] != 9)))) break;
            local_e0 = pbVar6 + 8;
            bVar2 = parseOnOff((char **)&local_e0,(bool)uVar7);
            texopt->blendv = bVar2;
            linebuf = (char *)local_e0;
          }
          uVar7 = 0x66;
          iVar3 = strncmp((char *)pbVar6,"-clamp",6);
          if ((iVar3 != 0) || ((pbVar6[6] != 0x20 && (pbVar6[6] != 9)))) break;
          local_e0 = pbVar6 + 7;
          bVar2 = parseOnOff((char **)&local_e0,(bool)uVar7);
          texopt->clamp = bVar2;
          linebuf = (char *)local_e0;
        }
        iVar3 = strncmp((char *)pbVar6,"-boost",6);
        if ((iVar3 != 0) || ((pbVar6[6] != 0x20 && (pbVar6[6] != 9)))) break;
        local_e0 = pbVar6 + 7;
        rVar8 = parseReal((char **)&local_e0,1.0);
        texopt->sharpness = rVar8;
        linebuf = (char *)local_e0;
      }
      bVar1 = *pbVar6;
      if (bVar1 == 0x2d) break;
LAB_00106e0d:
      iVar3 = strncmp((char *)pbVar6,"-type",5);
      if ((iVar3 == 0) && ((pbVar6[5] == 0x20 || (pbVar6[5] == 9)))) {
        pbVar6 = pbVar6 + 5;
        local_e0 = pbVar6;
        sVar4 = strspn((char *)pbVar6," \t");
        pbVar6 = pbVar6 + sVar4;
        local_e0 = pbVar6;
        sVar4 = strcspn((char *)pbVar6," \t\r");
        iVar3 = strncmp((char *)pbVar6,"cube_top",8);
        tVar5 = TEXTURE_TYPE_CUBE_TOP;
        if (iVar3 != 0) {
          iVar3 = strncmp((char *)pbVar6,"cube_bottom",0xb);
          tVar5 = TEXTURE_TYPE_CUBE_BOTTOM;
          if (iVar3 != 0) {
            iVar3 = strncmp((char *)pbVar6,"cube_left",9);
            tVar5 = TEXTURE_TYPE_CUBE_LEFT;
            if (iVar3 != 0) {
              iVar3 = strncmp((char *)pbVar6,"cube_right",10);
              tVar5 = TEXTURE_TYPE_CUBE_RIGHT;
              if (iVar3 != 0) {
                iVar3 = strncmp((char *)pbVar6,"cube_front",10);
                tVar5 = TEXTURE_TYPE_CUBE_FRONT;
                if (iVar3 != 0) {
                  iVar3 = strncmp((char *)pbVar6,"cube_back",9);
                  tVar5 = TEXTURE_TYPE_CUBE_BACK;
                  if (iVar3 != 0) {
                    iVar3 = strncmp((char *)pbVar6,"sphere",6);
                    tVar5 = (texture_type_t)(iVar3 == 0);
                  }
                }
              }
            }
          }
        }
        linebuf = (char *)(pbVar6 + sVar4);
        texopt->type = tVar5;
        local_e0 = (byte *)linebuf;
      }
      else {
        iVar3 = strncmp((char *)pbVar6,"-imfchan",8);
        if ((iVar3 == 0) && ((pbVar6[8] == 0x20 || (pbVar6[8] == 9)))) {
          local_e0 = pbVar6 + 9;
          sVar4 = strspn((char *)local_e0," \t");
          pbVar6 = pbVar6 + sVar4 + 9;
          local_e0 = pbVar6;
          sVar4 = strcspn((char *)pbVar6," \t\r");
          if (sVar4 == 1) {
            texopt->imfchan = *pbVar6;
          }
          linebuf = (char *)(pbVar6 + sVar4);
          local_e0 = (byte *)linebuf;
        }
        else if (((bVar1 == 0x2d) && ((pbVar6[1] == 0x6d && (pbVar6[2] == 0x6d)))) &&
                ((pbVar6[3] == 0x20 || (pbVar6[3] == 9)))) {
          local_e0 = pbVar6 + 4;
          parseReal2(local_c8,local_d0,(char **)&local_e0,1.0,
                     (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
          linebuf = (char *)local_e0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)pbVar6,&local_d5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&texture_name,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          linebuf = (char *)(pbVar6 + texture_name._M_string_length);
          local_d4 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          local_e0 = (byte *)linebuf;
        }
      }
    }
    if (((pbVar6[1] == 0x62) && (pbVar6[2] == 0x6d)) && ((pbVar6[3] == 0x20 || (pbVar6[3] == 9)))) {
      local_e0 = pbVar6 + 4;
      rVar8 = parseReal((char **)&local_e0,1.0);
      texopt->bump_multiplier = rVar8;
      linebuf = (char *)local_e0;
      goto LAB_00106ba4;
    }
    if ((pbVar6[1] == 0x6f) &&
       ((z = local_90, y = local_88, x = local_80, pbVar6[2] == 0x20 || (pbVar6[2] == 9)))) {
LAB_00106dfe:
      in_XMM1_Db = 0;
    }
    else {
      if ((pbVar6[1] != 0x73) || ((pbVar6[2] != 0x20 && (pbVar6[2] != 9)))) {
        if ((pbVar6[1] != 0x74) ||
           ((z = local_c0, y = local_b8, x = local_b0, pbVar6[2] != 0x20 && (pbVar6[2] != 9))))
        goto LAB_00106e0d;
        goto LAB_00106dfe;
      }
      in_XMM1_Db = 0x3ff00000;
      z = local_a8;
      y = local_a0;
      x = local_98;
    }
    local_e0 = pbVar6 + 3;
    in_XMM1_Da = 0;
    parseReal3(x,y,z,(char **)&local_e0,(double)((ulong)in_XMM1_Db << 0x20),
               (double)((ulong)in_XMM1_Db << 0x20),(double)((ulong)in_XMM1_Db << 0x20));
    linebuf = (char *)local_e0;
  } while( true );
}

Assistant:

static bool ParseTextureNameAndOption(std::string *texname,
                                      texture_option_t *texopt,
                                      const char *linebuf, const bool is_bump) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  // Fill with default value for texopt.
  if (is_bump) {
    texopt->imfchan = 'l';
  } else {
    texopt->imfchan = 'm';
  }
  texopt->bump_multiplier = 1.0f;
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  texopt->sharpness = 1.0f;
  texopt->brightness = 0.0f;
  texopt->contrast = 1.0f;
  texopt->origin_offset[0] = 0.0f;
  texopt->origin_offset[1] = 0.0f;
  texopt->origin_offset[2] = 0.0f;
  texopt->scale[0] = 1.0f;
  texopt->scale[1] = 1.0f;
  texopt->scale[2] = 1.0f;
  texopt->turbulence[0] = 0.0f;
  texopt->turbulence[1] = 0.0f;
  texopt->turbulence[2] = 0.0f;
  texopt->type = TEXTURE_TYPE_NONE;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else {
      // Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}